

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_NE_COLLECTIONS_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_NE_COLLECTIONS_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  int *in_stack_fffffffffffff760;
  AssertionHelper local_7f8;
  Fixed local_7c8;
  undefined1 local_640 [8];
  AssertionResult iutest_ar_3;
  undefined1 local_610 [4];
  int size_3;
  Fixed local_5e0;
  undefined1 local_458 [8];
  AssertionResult iutest_ar_2;
  undefined1 local_428 [4];
  int size_2;
  Fixed local_3f8;
  undefined1 local_270 [8];
  AssertionResult iutest_ar_1;
  int size_1;
  Fixed local_210;
  undefined1 local_78 [8];
  AssertionResult iutest_ar;
  int iStack_48;
  int size;
  int b [5];
  char local_28 [8];
  int a [5];
  iu_GTestSyntaxTest_x_iutest_x_NE_COLLECTIONS_Test *this_local;
  
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\x01';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  a[0] = 2;
  a[1] = 3;
  a[2] = 4;
  _iStack_48 = 0x200000000;
  b[0] = 2;
  b[1] = 3;
  b[2] = 4;
  iutest_ar._36_4_ = 5;
  unique0x1000075c = this;
  iutest::detail::AlwaysZero();
  iuutil::CmpHelperNeCollections<int*,int*>
            ((AssertionResult *)local_78,(iuutil *)0x558ae1,"a+(sizeof(a)/sizeof(a[0]))","b",
             "b+(sizeof(b)/sizeof(b[0]))",local_28,a + 3,&iStack_48,b + 3,in_stack_fffffffffffff760)
  ;
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    memset(&local_210,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_210);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_210,iutest_ar._36_4_);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_78);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&size_1,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0x54,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&size_1,pFVar2);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&size_1);
    iutest::AssertionHelper::Fixed::~Fixed(&local_210);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (iutest_ar_1._36_4_ == 0) {
    iutest_ar_1.m_result = true;
    iutest_ar_1._33_3_ = 0;
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperNeCollections<int*,int*>
              ((AssertionResult *)local_270,(iuutil *)0x558ae1,"a+(sizeof(a)/sizeof(a[0]))","b",
               "b+(sizeof(b)/sizeof(b[0]))",local_28,a + 3,&iStack_48,b + 3,
               in_stack_fffffffffffff760);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
    if (!bVar1) {
      memset(&local_3f8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3f8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3f8,iutest_ar_1._32_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_270);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x56,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_428,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_428);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3f8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_270);
    iutest_ar_2._36_4_ = 5;
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperNeCollections<int*,int*>
              ((AssertionResult *)local_458,(iuutil *)0x558ae1,"a+(sizeof(a)/sizeof(a[0]))","b",
               "b+(sizeof(b)/sizeof(b[0]))",local_28,a + 3,&iStack_48,b + 3,
               in_stack_fffffffffffff760);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
    if (!bVar1) {
      memset(&local_5e0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5e0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5e0,iutest_ar_2._36_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_458);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_610,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x58,pcVar3,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_610,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_610);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5e0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_458);
    iutest_ar_3._36_4_ = 5;
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperNeCollections<int*,int*>
              ((AssertionResult *)local_640,(iuutil *)0x558ae1,"a+(sizeof(a)/sizeof(a[0]))","b",
               "b+(sizeof(b)/sizeof(b[0]))",local_28,a + 3,&iStack_48,b + 3,
               in_stack_fffffffffffff760);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
    if (!bVar1) {
      memset(&local_7c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7c8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_7c8,iutest_ar_3._36_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_640);
      iutest::AssertionHelper::AssertionHelper
                (&local_7f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x5a,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7f8,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_7f8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7c8);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  }
  return;
}

Assistant:

TEST(GTestSyntaxTest, NE_COLLECTIONS)
{
    int a[] = { 0, 1, 2, 3, 4 };
    int b[] = { 0, 2, 2, 3, 4 };

    if( int size = (sizeof(a)/sizeof(a[0])) )
        ASSERT_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        EXPECT_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        INFORM_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        ASSUME_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
}